

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lbaselib.c
# Opt level: O2

int ipairsaux(lua_State *L)

{
  lua_Integer lVar1;
  int iVar2;
  
  lVar1 = luaL_checkinteger(L,2);
  luaL_checktype(L,1,5);
  iVar2 = (int)lVar1 + 1;
  lua_pushinteger(L,(long)iVar2);
  lua_rawgeti(L,1,iVar2);
  iVar2 = lua_type(L,-1);
  return 2 - (uint)(iVar2 == 0);
}

Assistant:

static int ipairsaux (lua_State *L) {
  int i = luaL_checkint(L, 2);
  luaL_checktype(L, 1, LUA_TTABLE);
  i++;  /* next value */
  lua_pushinteger(L, i);
  lua_rawgeti(L, 1, i);
  return (lua_isnil(L, -1)) ? 1 : 2;
}